

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,float power,
                float linear_zero_pos)

{
  int in_EDI;
  float fVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float f_1;
  float f;
  double v_clamped;
  bool is_power;
  double local_50;
  bool local_42;
  float local_4;
  
  if ((in_XMM1_Qa != in_XMM2_Qa) || (NAN(in_XMM1_Qa) || NAN(in_XMM2_Qa))) {
    local_42 = false;
    if ((in_XMM3_Da != 1.0) || (NAN(in_XMM3_Da))) {
      local_42 = in_EDI == 8 || in_EDI == 9;
    }
    if (in_XMM2_Qa <= in_XMM1_Qa) {
      local_50 = ImClamp<double>(in_XMM0_Qa,in_XMM2_Qa,in_XMM1_Qa);
    }
    else {
      local_50 = ImClamp<double>(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
    }
    if (local_42) {
      if (0.0 <= local_50) {
        ImMax<double>(0.0,in_XMM1_Qa);
        ImMax<double>(0.0,in_XMM1_Qa);
        fVar1 = ImPow(0.0,4.282252e-39);
        local_4 = fVar1 * (1.0 - in_XMM4_Da) + in_XMM4_Da;
      }
      else {
        ImMin<double>(0.0,in_XMM2_Qa);
        fVar1 = ImPow(0.0,4.282012e-39);
        local_4 = (1.0 - fVar1) * in_XMM4_Da;
      }
    }
    else {
      local_4 = (float)((local_50 - in_XMM1_Qa) / (in_XMM2_Qa - in_XMM1_Qa));
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f / power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f / power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}